

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double dVar1;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  DenseStorage<double,__1,__1,_1,_0> *other;
  ulong uVar5;
  char *__function;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Scalar SVar10;
  double dVar11;
  double dVar12;
  double *extraout_XMM0_Qb;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double *pdVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  VectorXd yy;
  VectorXd xscaled;
  anon_class_64_1_54a39805 secant;
  double local_138;
  double local_128;
  double local_110;
  double local_108;
  double *pdStack_100;
  double local_f8;
  undefined8 uStack_f0;
  long local_e8;
  double local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  undefined1 local_d0 [56];
  ChebyshevExpansion local_98;
  double local_58;
  double *pdStack_50;
  DenseStorage<double,__1,__1,_1,_0> *local_48;
  DenseStorage<double,__1,__1,_1,_0> *local_40;
  double *local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_d8 = __return_storage_ptr__;
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          ChebyshevLobattoNodesLibrary::get
                    ((ChebyshevLobattoNodesLibrary *)CLnodes_library,lVar7 * 2 - 2);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)(local_d0 + 0x28),other);
  y_Clenshaw_xscaled((ChebyshevExpansion *)local_d0,&this->m_c);
  if ((long)local_d0._8_8_ < 1) {
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
    ;
  }
  else {
    local_98.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_d0._0_8_;
    local_d0._16_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
         ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_d0 + 0x38),
                    (scalar_max_op<double,_double,_0> *)&local_110,
                    (Matrix<double,__1,_1,_0,__1,_1> *)local_d0);
    if (0 < (long)local_d0._8_8_) {
      local_98.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)local_d0._0_8_;
      SVar10 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
               ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          (local_d0 + 0x38),(scalar_min_op<double,_double,_0> *)&local_110,
                          (Matrix<double,__1,_1,_0,__1,_1> *)local_d0);
      lVar7 = lVar7 * 2 + -1;
      if (2 < lVar7) {
        local_d0._16_8_ = ((double)local_d0._16_8_ - SVar10) * 1e-14;
        local_38 = &this->m_xmin;
        local_40 = (DenseStorage<double,__1,__1,_1,_0> *)&this->m_recurrence_buffer;
        local_48 = (DenseStorage<double,__1,__1,_1,_0> *)&this->m_nodal_value_cache;
        lVar9 = 2;
        uVar8 = 0;
        local_e8 = lVar7;
        do {
          uVar4 = local_d0._40_8_;
          uVar3 = local_d0._0_8_;
          if ((((((long)local_d0._48_8_ <= (long)uVar8) || ((long)local_d0._8_8_ <= (long)uVar8)) ||
               (uVar5 = uVar8 | 1, (long)local_d0._48_8_ <= (long)uVar5)) ||
              (((long)local_d0._8_8_ <= (long)uVar5 || ((long)local_d0._48_8_ <= lVar9)))) ||
             ((long)local_d0._8_8_ <= lVar9)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          dVar11 = *(double *)(local_d0._0_8_ + uVar8 * 8);
          if ((double)local_d0._16_8_ <= ABS(dVar11)) {
            dVar22 = *(double *)(local_d0._40_8_ + lVar9 * 8);
            dVar12 = *(double *)(local_d0._40_8_ + uVar5 * 8);
            dVar13 = dVar22 - dVar12;
            dVar16 = *(double *)(local_d0._40_8_ + uVar8 * 8);
            dVar21 = dVar12 - dVar16;
            dVar17 = dVar22 - dVar16;
            dVar14 = dVar13 * dVar21 * dVar17;
            dVar15 = *(double *)(local_d0._0_8_ + uVar5 * 8);
            dVar1 = *(double *)(local_d0._0_8_ + lVar9 * 8);
            dVar20 = (dVar21 * dVar1 + (dVar13 * dVar11 - dVar15 * dVar17)) / dVar14;
            dVar19 = (((dVar22 * dVar22 - dVar16 * dVar16) * dVar15 -
                      (dVar22 * dVar22 - dVar12 * dVar12) * dVar11) -
                     (dVar12 * dVar12 - dVar16 * dVar16) * dVar1) / dVar14;
            dVar14 = (dVar21 * dVar12 * dVar16 * dVar1 +
                     (dVar13 * dVar12 * dVar22 * dVar11 - dVar17 * dVar16 * dVar22 * dVar15)) /
                     dVar14;
            dVar11 = dVar19 * dVar19 + dVar20 * -4.0 * dVar14;
            if (0.0 <= dVar11) {
              if ((dVar20 != 0.0) || (NAN(dVar20))) {
                if ((dVar11 == 0.0) && (!NAN(dVar11))) {
                  dVar22 = -dVar19 / (dVar20 + dVar20);
                  goto LAB_00131e87;
                }
                if (dVar11 < 0.0) {
                  uStack_f0 = 0;
                  local_f8 = dVar14;
                  dVar11 = sqrt(dVar11);
                  dVar14 = local_f8;
                }
                else {
                  dVar11 = SQRT(dVar11);
                }
                if (0.0 <= dVar19) {
                  dVar12 = (dVar14 + dVar14) / (-dVar19 - dVar11);
                  dVar22 = (-dVar19 - dVar11) / (dVar20 + dVar20);
                }
                else {
                  dVar22 = (dVar14 + dVar14) / (dVar11 - dVar19);
                  dVar12 = (dVar11 - dVar19) / (dVar20 + dVar20);
                }
              }
              else {
                dVar22 = -dVar14 / dVar19;
LAB_00131e87:
                dVar12 = -1000.0;
              }
              dVar11 = *(double *)(uVar4 + uVar8 * 8);
              dVar16 = *(double *)(uVar4 + lVar9 * 8);
              dVar15 = dVar16;
              if (dVar11 <= dVar16) {
                dVar15 = dVar11;
              }
              if (dVar16 <= dVar11) {
                dVar16 = dVar11;
              }
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)(local_d0 + 0x38),
                         (DenseStorage<double,__1,__1,_1,_0> *)this);
              local_98.m_xmin = *local_38;
              local_98.m_xmax = local_38[1];
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)&local_98.m_recurrence_buffer,
                         local_40);
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)&local_98.m_nodal_value_cache,
                         local_48);
              __return_storage_ptr__ = local_d8;
              if ((dVar15 < dVar22 && dVar22 < dVar16) && (dVar15 < dVar12 && dVar12 < dVar16)) {
                local_138 = -dVar19 / (dVar20 + dVar20);
                local_58 = y_Clenshaw_xscaled(this,local_138);
                dVar11 = *(double *)(uVar4 + uVar8 * 8);
                local_108 = *(double *)(uVar3 + uVar8 * 8);
                pdStack_100 = (double *)0x0;
                local_f8 = local_138 - ((local_138 - dVar11) * local_58) / (local_58 - local_108);
                uStack_f0 = 0x8000000000000000;
                pdStack_50 = extraout_XMM0_Qb;
                dVar12 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_f8);
                __return_storage_ptr__ = local_d8;
                iVar6 = 0x32;
                local_e0 = local_58;
                pdVar18 = pdStack_100;
                dVar22 = local_138;
                do {
                  dVar15 = dVar12 * local_108;
                  dVar16 = local_f8;
                  if (dVar15 <= 0.0) {
                    dVar16 = dVar11;
                  }
                  if (ABS(dVar12) < 1e-14) break;
                  uVar5 = -(ulong)(0.0 < dVar15);
                  dVar22 = (double)(~uVar5 & (ulong)local_f8 | (ulong)dVar22 & uVar5);
                  if (ABS(dVar22 - dVar16) < 1e-14) break;
                  if (dVar15 <= 0.0) {
                    local_e0 = dVar12;
                  }
                  local_d0._24_8_ = ~uVar5 & (ulong)local_108 | (ulong)dVar12 & uVar5;
                  local_f8 = dVar22 - ((dVar22 - dVar16) * local_e0) /
                                      (local_e0 - (double)local_d0._24_8_);
                  local_108 = dVar16;
                  local_d0._32_8_ = pdVar18;
                  dVar12 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_f8);
                  iVar6 = iVar6 + -1;
                  dVar11 = local_108;
                  local_108 = (double)local_d0._24_8_;
                  pdVar18 = (double *)local_d0._32_8_;
                } while (iVar6 != 0);
                local_128 = *(double *)(uVar4 + lVar9 * 8);
                local_e0 = *(double *)(uVar3 + lVar9 * 8);
                local_108 = local_128 - ((local_128 - local_138) * local_e0) / (local_e0 - local_58)
                ;
                pdStack_100 = (double *)0x0;
                dVar22 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_108);
                iVar6 = 0x32;
                dVar11 = local_58;
                do {
                  dVar16 = dVar22 * dVar11;
                  dVar12 = local_108;
                  if (dVar16 <= 0.0) {
                    dVar12 = local_138;
                  }
                  if (ABS(dVar22) < 1e-14) break;
                  uVar5 = -(ulong)(0.0 < dVar16);
                  local_128 = (double)(~uVar5 & (ulong)local_108 | (ulong)local_128 & uVar5);
                  if (ABS(local_128 - dVar12) < 1e-14) break;
                  if (dVar16 <= 0.0) {
                    local_e0 = dVar22;
                  }
                  local_d0._24_8_ = ~uVar5 & (ulong)dVar11 | (ulong)dVar22 & uVar5;
                  local_108 = local_128 -
                              ((local_128 - dVar12) * local_e0) /
                              (local_e0 - (double)local_d0._24_8_);
                  local_d0._32_8_ = pdStack_50;
                  dVar22 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_108);
                  iVar6 = iVar6 + -1;
                  dVar11 = (double)local_d0._24_8_;
                  pdStack_50 = (double *)local_d0._32_8_;
                  local_138 = dVar12;
                } while (iVar6 != 0);
                local_110 = (this->m_xmax + this->m_xmin + (this->m_xmax - this->m_xmin) * local_f8)
                            * 0.5;
                iVar2._M_current =
                     (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (__return_storage_ptr__,iVar2,&local_110);
                }
                else {
                  *iVar2._M_current = local_110;
                  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                lVar7 = local_e8;
                local_110 = (this->m_xmax + this->m_xmin + (this->m_xmax - this->m_xmin) * local_108
                            ) * 0.5;
                iVar2._M_current =
                     (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (__return_storage_ptr__,iVar2,&local_110);
                }
                else {
                  *iVar2._M_current = local_110;
                  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
              }
              else {
                lVar7 = local_e8;
                if ((dVar15 < dVar22 && dVar22 < dVar16) != (dVar15 < dVar12 && dVar12 < dVar16)) {
                  local_108 = *(double *)(uVar4 + uVar8 * 8);
                  local_138 = *(double *)(uVar3 + uVar8 * 8);
                  local_128 = *(double *)(uVar4 + lVar9 * 8);
                  local_d0._24_8_ = *(double *)(uVar3 + lVar9 * 8);
                  local_f8 = local_128 -
                             ((local_128 - local_108) * (double)local_d0._24_8_) /
                             ((double)local_d0._24_8_ - local_138);
                  uStack_f0 = 0;
                  dVar11 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_f8);
                  iVar6 = 0x32;
                  do {
                    dVar12 = dVar11 * local_138;
                    dVar22 = local_f8;
                    if (dVar12 <= 0.0) {
                      dVar22 = local_108;
                    }
                    if (ABS(dVar11) < 1e-14) break;
                    uVar5 = -(ulong)(0.0 < dVar12);
                    local_128 = (double)(~uVar5 & (ulong)local_f8 | (ulong)local_128 & uVar5);
                    if (ABS(local_128 - dVar22) < 1e-14) break;
                    if (dVar12 <= 0.0) {
                      local_d0._24_8_ = dVar11;
                    }
                    local_138 = (double)(~uVar5 & (ulong)local_138 | (ulong)dVar11 & uVar5);
                    local_f8 = local_128 -
                               ((local_128 - dVar22) * (double)local_d0._24_8_) /
                               ((double)local_d0._24_8_ - local_138);
                    local_108 = dVar22;
                    dVar11 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_d0 + 0x38),local_f8);
                    iVar6 = iVar6 + -1;
                  } while (iVar6 != 0);
                  local_110 = (this->m_xmax + this->m_xmin +
                              (this->m_xmax - this->m_xmin) * local_f8) * 0.5;
                  iVar2._M_current =
                       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (__return_storage_ptr__,iVar2,&local_110);
                    lVar7 = local_e8;
                  }
                  else {
                    *iVar2._M_current = local_110;
                    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                    lVar7 = local_e8;
                  }
                }
              }
              free(local_98.m_nodal_value_cache.
                   super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
              free(local_98.m_recurrence_buffer.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
              free(local_98.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
            }
          }
          else {
            local_98.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)
                     (((this->m_xmax - this->m_xmin) * *(double *)(local_d0._40_8_ + uVar8 * 8) +
                      this->m_xmax + this->m_xmin) * 0.5);
            iVar2._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (__return_storage_ptr__,iVar2,(double *)(local_d0 + 0x38));
            }
            else {
              *iVar2._M_current =
                   (double)local_98.m_c.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data;
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          lVar9 = lVar9 + 2;
          uVar8 = uVar8 + 2;
        } while (lVar9 < lVar7);
      }
      free((void *)local_d0._0_8_);
      free((void *)local_d0._40_8_);
      return __return_storage_ptr__;
    }
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
    ;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,__function);
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots2(bool only_in_domain) const {
        //vector of roots to be returned
        std::vector<double> roots;

        auto N = m_c.size()-1;
        auto Ndegree_scaled = N*2;
        Eigen::VectorXd xscaled = get_CLnodes(Ndegree_scaled), yy = y_Clenshaw_xscaled(xscaled);
        double ytol = 1e-14*(yy.maxCoeff()-yy.minCoeff());
        
        // a,b,c can also be obtained by solving the matrix system:
        // [x_k^2, x_k, 1] = [b_k] for k in 1,2,3
        for (auto i = 0; i+2 < Ndegree_scaled+1; i += 2){
            const double &x_1 = xscaled[i + 0], &y_1 = yy[i + 0],
                         &x_2 = xscaled[i + 1], &y_2 = yy[i + 1],
                         &x_3 = xscaled[i + 2], &y_3 = yy[i + 2];
            double d = (x_3 - x_2)*(x_2 - x_1)*(x_3 - x_1);
            double a = ((x_3 - x_2)*y_1 - (x_3 - x_1)*y_2 + (x_2 - x_1)*y_3) / d;
            double b = (-(POW2(x_3) - POW2(x_2))*y_1 + (POW2(x_3) - POW2(x_1))*y_2 - (POW2(x_2) - POW2(x_1))*y_3) / d;
            double c = ((x_3 - x_2)*x_2*x_3*y_1 - (x_3 - x_1)*x_1*x_3*y_2 + (x_2 - x_1)*x_2*x_1*y_3) / d;

            // Check if precisely at a nodal value
            if (std::abs(y_1) < ytol) {
                roots.push_back(((m_xmax - m_xmin) * x_1 + (m_xmax + m_xmin)) / 2.0);
                continue;
            }

            // Discriminant of quadratic
            double D = b*b - 4*a*c;
            if (D >= 0) {
                double root1, root2;
                if (a == 0){
                    // Linear
                    root1 = -c/b;
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else if (D == 0) { // Unlikely due to numerical precision
                    // Two equal real roots
                    root1 = -b/(2*a);
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else {
                    // Numerically stable method for solving quadratic
                    // From https://people.csail.mit.edu/bkph/articles/Quadratics.pdf
                    double sqrtD = sqrt(D);
                    if (b >= 0){
                        root1 = (-b - sqrtD)/(2*a);
                        root2 = 2*c/(-b-sqrtD);
                    }
                    else {
                        root1 = 2*c/(-b+sqrtD);
                        root2 = (-b+sqrtD)/(2*a);
                    }
                }
                bool in1 = inbetween(x_1, x_3, root1), in2 = inbetween(x_1, x_3, root2);
                const ChebyshevExpansion &e = *this;
                auto secant = [e](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
                    auto c = b - yb*(b - a) / (yb - ya);
                    auto yc = e.y_Clenshaw_xscaled(c);
                    for (auto i = 0; i < 50; ++i){
                        if (yc*ya > 0) {
                            a=c; ya=yc;
                        }
                        else {
                            b=c; yb=yc;
                        }
                        if (std::abs(b - a) < xeps) { break; }
                        if (std::abs(yc) < yeps){ break; }
                        c = b - yb*(b - a) / (yb - ya);
                        yc = e.y_Clenshaw_xscaled(c);
                    }
                    return c;
                };
                int Nroots_inside = static_cast<int>(in1) + static_cast<int>(in2);
                if (Nroots_inside == 2) {
                    // Split the domain at the midline of the quadratic, polish each root against the underlying expansion
                    double x_m = -b/(2*a), y_m = e.y_Clenshaw_xscaled(x_m);
                    root1 = secant(x_1, y_1, x_m, y_m);
                    root2 = secant(x_m, y_m, x_3, y_3);
                    // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0); 
                    roots.push_back(((m_xmax - m_xmin)*root2 + (m_xmax + m_xmin)) / 2.0);
                }
                else if(Nroots_inside == 1) {
                    root1 = secant(x_1, y_1, x_3, y_3);
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0);
                }
                else {}
            }
        }
        return roots;
    }